

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::IdentifierExpression::~IdentifierExpression(IdentifierExpression *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_00163de8;
  this_00 = (this->variable).super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->identifier).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

IdentifierExpression::~IdentifierExpression()
{
}